

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O2

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::Disk::Intersect
          (optional<pbrt::ShapeIntersection> *__return_storage_ptr__,Disk *this,Ray *ray,Float tMax)

{
  QuadricIntersection *pQVar1;
  undefined1 in_register_00001204 [60];
  undefined1 auVar2 [64];
  Vector3<float> VVar4;
  optional<pbrt::QuadricIntersection> isect;
  SurfaceInteraction intr;
  optional<pbrt::QuadricIntersection> local_230;
  ShapeIntersection local_218;
  SurfaceInteraction local_118;
  undefined1 auVar3 [56];
  
  auVar3 = in_register_00001204._4_56_;
  BasicIntersect(&local_230,this,ray,tMax);
  if (local_230.set == false) {
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  else {
    pQVar1 = pstd::optional<pbrt::QuadricIntersection>::value(&local_230);
    VVar4 = Tuple3<pbrt::Vector3,_float>::operator-(&(ray->d).super_Tuple3<pbrt::Vector3,_float>);
    auVar2._0_8_ = VVar4.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar2._8_56_ = auVar3;
    local_218.intr.super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.x = (Interval)vmovlps_avx(auVar2._0_16_);
    local_218.intr.super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low = VVar4.super_Tuple3<pbrt::Vector3,_float>.z;
    InteractionFromIntersection(&local_118,this,pQVar1,(Vector3f *)&local_218,ray->time);
    local_218.intr.super_Interaction.mediumInterface = local_118.super_Interaction.mediumInterface;
    local_218.intr.super_Interaction.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = local_118.super_Interaction.medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
    local_218.intr.super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.x =
         local_118.super_Interaction.pi.super_Point3<pbrt::Interval>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
    local_218.intr.super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y =
         local_118.super_Interaction.pi.super_Point3<pbrt::Interval>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
    local_218.intr.super_Interaction.pi.super_Point3<pbrt::Interval>.
    super_Tuple3<pbrt::Point3,_pbrt::Interval>.z =
         local_118.super_Interaction.pi.super_Point3<pbrt::Interval>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
    local_218.intr.super_Interaction.time = local_118.super_Interaction.time;
    local_218.intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x =
         local_118.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.x;
    local_218.intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y =
         local_118.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.y;
    local_218.intr.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z =
         local_118.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z;
    local_218.intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x =
         local_118.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
    local_218.intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y =
         local_118.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.y;
    local_218.intr.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z =
         local_118.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
    local_218.intr.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x =
         local_118.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.x;
    local_218.intr.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y =
         local_118.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float>.y;
    local_218.intr.super_Interaction._60_4_ = local_118.super_Interaction._60_4_;
    local_218.intr.dpdu.super_Tuple3<pbrt::Vector3,_float>.x =
         local_118.dpdu.super_Tuple3<pbrt::Vector3,_float>.x;
    local_218.intr.dpdu.super_Tuple3<pbrt::Vector3,_float>.y =
         local_118.dpdu.super_Tuple3<pbrt::Vector3,_float>.y;
    local_218.intr.dpdu.super_Tuple3<pbrt::Vector3,_float>.z =
         local_118.dpdu.super_Tuple3<pbrt::Vector3,_float>.z;
    local_218.intr.dpdv.super_Tuple3<pbrt::Vector3,_float>.x =
         local_118.dpdv.super_Tuple3<pbrt::Vector3,_float>.x;
    local_218.intr.dpdv.super_Tuple3<pbrt::Vector3,_float>.y =
         local_118.dpdv.super_Tuple3<pbrt::Vector3,_float>.y;
    local_218.intr.dpdv.super_Tuple3<pbrt::Vector3,_float>.z =
         local_118.dpdv.super_Tuple3<pbrt::Vector3,_float>.z;
    local_218.intr.dndu.super_Tuple3<pbrt::Normal3,_float>.x =
         local_118.dndu.super_Tuple3<pbrt::Normal3,_float>.x;
    local_218.intr.dndu.super_Tuple3<pbrt::Normal3,_float>.y =
         local_118.dndu.super_Tuple3<pbrt::Normal3,_float>.y;
    local_218.intr.dndu.super_Tuple3<pbrt::Normal3,_float>.z =
         local_118.dndu.super_Tuple3<pbrt::Normal3,_float>.z;
    local_218.intr.dndv.super_Tuple3<pbrt::Normal3,_float>.x =
         local_118.dndv.super_Tuple3<pbrt::Normal3,_float>.x;
    local_218.intr.dndv.super_Tuple3<pbrt::Normal3,_float>.y =
         local_118.dndv.super_Tuple3<pbrt::Normal3,_float>.y;
    local_218.intr.dndv.super_Tuple3<pbrt::Normal3,_float>.z =
         local_118.dndv.super_Tuple3<pbrt::Normal3,_float>.z;
    local_218.intr.shading.n.super_Tuple3<pbrt::Normal3,_float>.x =
         local_118.shading.n.super_Tuple3<pbrt::Normal3,_float>.x;
    local_218.intr.shading.n.super_Tuple3<pbrt::Normal3,_float>.y =
         local_118.shading.n.super_Tuple3<pbrt::Normal3,_float>.y;
    local_218.intr.shading.n.super_Tuple3<pbrt::Normal3,_float>.z =
         local_118.shading.n.super_Tuple3<pbrt::Normal3,_float>.z;
    local_218.intr.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.x =
         local_118.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.x;
    local_218.intr.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.y =
         local_118.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.y;
    local_218.intr.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.z =
         local_118.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>.z;
    local_218.intr.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.x =
         local_118.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.x;
    local_218.intr.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.y =
         local_118.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.y;
    local_218.intr.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.z =
         local_118.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>.z;
    local_218.intr.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.x =
         local_118.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.x;
    local_218.intr.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.y =
         local_118.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.y;
    local_218.intr.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.z =
         local_118.shading.dndu.super_Tuple3<pbrt::Normal3,_float>.z;
    local_218.intr.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.x =
         local_118.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.x;
    local_218.intr.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.y =
         local_118.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.y;
    local_218.intr.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.z =
         local_118.shading.dndv.super_Tuple3<pbrt::Normal3,_float>.z;
    local_218.intr.faceIndex = local_118.faceIndex;
    local_218.intr.material.
    super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
    .bits = local_118.material.
            super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
            .bits;
    local_218.intr.areaLight.
    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
    .bits = local_118.areaLight.
            super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
            .bits;
    local_218.intr.dudy = local_118.dudy;
    local_218.intr.dvdy = local_118.dvdy;
    local_218.intr.dpdx.super_Tuple3<pbrt::Vector3,_float>.x =
         local_118.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
    local_218.intr.dpdx.super_Tuple3<pbrt::Vector3,_float>.y =
         local_118.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
    local_218.intr.dpdx.super_Tuple3<pbrt::Vector3,_float>.z =
         local_118.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
    local_218.intr.dpdy.super_Tuple3<pbrt::Vector3,_float>.x =
         local_118.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
    local_218.intr.dpdy.super_Tuple3<pbrt::Vector3,_float>.y =
         local_118.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
    local_218.intr.dpdy.super_Tuple3<pbrt::Vector3,_float>.z =
         local_118.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
    local_218.intr.dudx = local_118.dudx;
    local_218.intr.dvdx = local_118.dvdx;
    pQVar1 = pstd::optional<pbrt::QuadricIntersection>::value(&local_230);
    local_218.tHit = pQVar1->tHit;
    pstd::optional<pbrt::ShapeIntersection>::optional(__return_storage_ptr__,&local_218);
  }
  pstd::optional<pbrt::QuadricIntersection>::~optional(&local_230);
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeIntersection> Intersect(const Ray &ray,
                                                Float tMax = Infinity) const {
        pstd::optional<QuadricIntersection> isect = BasicIntersect(ray, tMax);
        if (!isect)
            return {};
        SurfaceInteraction intr = InteractionFromIntersection(*isect, -ray.d, ray.time);
        return ShapeIntersection{intr, isect->tHit};
    }